

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEAngle.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> * __thiscall CEAngle::DmsVect(CEAngle *this)

{
  undefined8 uVar1;
  int iVar2;
  reference pvVar3;
  reference pvVar4;
  long in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar5;
  vector<int,_std::allocator<int>_> *this_00;
  vector<int,_std::allocator<int>_> DMS_i;
  char sign;
  vector<double,_std::allocator<double>_> *DMS_d;
  allocator_type *in_stack_ffffffffffffff48;
  value_type_conflict *in_stack_ffffffffffffff50;
  size_type in_stack_ffffffffffffff58;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff60;
  double local_90;
  vector<int,_std::allocator<int>_> local_30;
  char local_11 [17];
  
  std::allocator<int>::allocator((allocator<int> *)0x14721e);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff60,
             in_stack_ffffffffffffff58,(value_type_conflict2 *)in_stack_ffffffffffffff50,
             (allocator_type *)in_stack_ffffffffffffff48);
  std::allocator<int>::~allocator((allocator<int> *)0x14724c);
  uVar1 = *(undefined8 *)(in_RSI + 8);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,0);
  iauA2af(uVar1,9,local_11,pvVar3);
  std::allocator<double>::allocator((allocator<double> *)0x1472aa);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff48);
  std::allocator<double>::~allocator((allocator<double> *)0x1472cf);
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,0);
  iVar2 = *pvVar3;
  local_90 = -1.0;
  if (local_11[0] != '-') {
    local_90 = 1.0;
  }
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
  *pvVar4 = (double)iVar2 * local_90;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,1);
  dVar5 = (double)*pvVar3;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,1);
  *pvVar4 = dVar5;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,2);
  this_00 = (vector<int,_std::allocator<int>_> *)(double)*pvVar3;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,2);
  *pvVar4 = (value_type)this_00;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_30,3);
  dVar5 = (double)*pvVar3 * 1e-09;
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,3);
  *pvVar4 = dVar5;
  std::vector<int,_std::allocator<int>_>::~vector(this_00);
  return in_RDI;
}

Assistant:

std::vector<double> CEAngle::DmsVect(void) const
{
    // Variables for holding the results
    char sign;
    std::vector<int> DMS_i(4, 0.0);

    // Run the appropriate SOFA value
    iauA2af(9, angle_, &sign, &DMS_i[0]);

    // Fill the values into a double vector
    std::vector<double> DMS_d(4, 0.0);
    DMS_d[0] = DMS_i[0] * (sign == '-' ? -1.0 : 1.0);
    DMS_d[1] = DMS_i[1];
    DMS_d[2] = DMS_i[2];
    DMS_d[3] = DMS_i[3] * 1.0e-9;

    return DMS_d ;
}